

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

LPCVOID PAL_GetSymbolModuleBase(void *symbol)

{
  int iVar1;
  undefined1 local_38 [8];
  Dl_info info;
  LPCVOID retval;
  void *symbol_local;
  
  info.dli_saddr = (void *)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (symbol == (void *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0xd);
  }
  else {
    iVar1 = dladdr(symbol,local_38);
    if (iVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0xd);
    }
    else {
      info.dli_saddr = info.dli_fname;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return info.dli_saddr;
  }
  abort();
}

Assistant:

LPCVOID
PALAPI
PAL_GetSymbolModuleBase(void *symbol)
{
    LPCVOID retval = nullptr;

    PERF_ENTRY(PAL_GetPalModuleBase);
    ENTRY("PAL_GetPalModuleBase\n");

    if (symbol == nullptr)
    {
        TRACE("Can't get base address. Argument symbol == nullptr\n");
        SetLastError(ERROR_INVALID_DATA);
    }
    else
    {
        Dl_info info;
        if (dladdr(symbol, &info) != 0)
        {
            retval = info.dli_fbase;
        }
        else
        {
            TRACE("Can't get base address of the current module\n");
            SetLastError(ERROR_INVALID_DATA);
        }
    }

    LOGEXIT("PAL_GetPalModuleBase returns %p\n", retval);
    PERF_EXIT(PAL_GetPalModuleBase);
    return retval;
}